

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O0

ARKodeSPRKTable arkodeSymplecticMcLachlan5(void)

{
  ARKodeSPRKTable sprk_table;
  int in_stack_ffffffffffffffec;
  ARKodeSPRKTable local_8;
  
  local_8 = ARKodeSPRKTable_Alloc(in_stack_ffffffffffffffec);
  if (local_8 == (ARKodeSPRKTable)0x0) {
    local_8 = (ARKodeSPRKTable)0x0;
  }
  else {
    local_8->q = 5;
    local_8->stages = 6;
    *local_8->a = 0.33983962583911;
    local_8->a[1] = -0.08860133690302732;
    local_8->a[2] = 0.5858564768259621;
    local_8->a[3] = -0.6030393565364919;
    local_8->a[4] = 0.3235807965546976;
    local_8->a[5] = 0.4423637942197495;
    *local_8->ahat = 0.11939002928756727;
    local_8->ahat[1] = 0.6989273703824752;
    local_8->ahat[2] = -0.17131235827160077;
    local_8->ahat[3] = 0.40126950225135344;
    local_8->ahat[4] = 0.010705081848235983;
    local_8->ahat[5] = -0.058979625498031166;
  }
  return local_8;
}

Assistant:

static ARKodeSPRKTable arkodeSymplecticMcLachlan5(void)
{
  ARKodeSPRKTable sprk_table = ARKodeSPRKTable_Alloc(6);
  if (!sprk_table) { return NULL; }
  sprk_table->q       = 5;
  sprk_table->stages  = 6;
  sprk_table->a[0]    = SUN_RCONST(0.339839625839110000);
  sprk_table->a[1]    = -SUN_RCONST(0.088601336903027329);
  sprk_table->a[2]    = SUN_RCONST(0.5858564768259621188);
  sprk_table->a[3]    = -SUN_RCONST(0.603039356536491888);
  sprk_table->a[4]    = SUN_RCONST(0.3235807965546976394);
  sprk_table->a[5]    = SUN_RCONST(0.4423637942197494587);
  sprk_table->ahat[0] = SUN_RCONST(0.1193900292875672758);
  sprk_table->ahat[1] = SUN_RCONST(0.6989273703824752308);
  sprk_table->ahat[2] = -SUN_RCONST(0.1713123582716007754);
  sprk_table->ahat[3] = SUN_RCONST(0.4012695022513534480);
  sprk_table->ahat[4] = SUN_RCONST(0.0107050818482359840);
  sprk_table->ahat[5] = -SUN_RCONST(0.0589796254980311632);
  return sprk_table;
}